

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blitter.hpp
# Opt level: O2

string * __thiscall
Amiga::Blitter<true>::Transaction::to_string_abi_cxx11_
          (string *__return_storage_ptr__,Transaction *this)

{
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->type < (AddToPipeline|ReadB)) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  std::__cxx11::to_string(&local_90,this->address);
  std::operator+(&local_70," address:",&local_90);
  std::operator+(&local_50,&local_70," value:");
  std::__cxx11::to_string(&local_b0,(uint)this->value);
  std::operator+(&local_30,&local_50,&local_b0);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const {
				std::string result;

				switch(type) {
					case Type::SkippedSlot:			result = "SkippedSlot";			break;
					case Type::ReadA:				result = "ReadA";				break;
					case Type::ReadB:				result = "ReadB";				break;
					case Type::ReadC:				result = "ReadC";				break;
					case Type::AddToPipeline:		result = "AddToPipeline";		break;
					case Type::WriteFromPipeline:	result = "WriteFromPipeline";	break;
				}

				result += " address:" + std::to_string(address) + " value:" + std::to_string(value);
				return result;
			}